

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpl_model.c
# Opt level: O0

int is_alike_mv(int_mv candidate_mv,center_mv_t *center_mvs,int center_mvs_count,
               int skip_alike_starting_mv)

{
  int iVar1;
  int i;
  int thr;
  int mv_diff_thr [3];
  int skip_alike_starting_mv_local;
  int center_mvs_count_local;
  center_mv_t *center_mvs_local;
  int_mv candidate_mv_local;
  
  mv_diff_thr[0] = 1;
  mv_diff_thr[1] = 0x40;
  mv_diff_thr[2] = 0x80;
  i = 0;
  do {
    if (center_mvs_count <= i) {
      return 0;
    }
    candidate_mv_local.as_mv.col = candidate_mv.as_mv.col;
    iVar1 = (int)center_mvs[i].mv.as_mv.col - (int)candidate_mv_local.as_mv.col;
    if (iVar1 < 1) {
      iVar1 = -iVar1;
    }
    if (iVar1 < mv_diff_thr[skip_alike_starting_mv]) {
      candidate_mv_local.as_mv.row = candidate_mv.as_mv.row;
      iVar1 = (int)center_mvs[i].mv.as_mv.row - (int)candidate_mv_local.as_mv.row;
      if (iVar1 < 1) {
        iVar1 = -iVar1;
      }
      if (iVar1 < mv_diff_thr[skip_alike_starting_mv]) {
        return 1;
      }
    }
    i = i + 1;
  } while( true );
}

Assistant:

static int is_alike_mv(int_mv candidate_mv, center_mv_t *center_mvs,
                       int center_mvs_count, int skip_alike_starting_mv) {
  // MV difference threshold is in 1/8 precision.
  const int mv_diff_thr[3] = { 1, (8 << 3), (16 << 3) };
  int thr = mv_diff_thr[skip_alike_starting_mv];
  int i;

  for (i = 0; i < center_mvs_count; i++) {
    if (abs(center_mvs[i].mv.as_mv.col - candidate_mv.as_mv.col) < thr &&
        abs(center_mvs[i].mv.as_mv.row - candidate_mv.as_mv.row) < thr)
      return 1;
  }

  return 0;
}